

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:214:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:214:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  gc_heap_ptr_untyped *p_00;
  void *pvVar4;
  long *plVar5;
  void *pvVar6;
  global_object *pgVar7;
  undefined8 *puVar8;
  function_object *this_00;
  native_error_exception *this_01;
  uint32_t index;
  pointer pvVar9;
  long lVar10;
  anon_class_16_1_570cf4e1_for_f *this_02;
  mjs *this_03;
  object_ptr a;
  object_ptr p;
  value local_240;
  gc_heap_ptr_untyped local_218;
  vector<mjs::value,_std::allocator<mjs::value>_> new_args;
  wstring local_1f0;
  value *local_1d0;
  gc_heap_ptr<mjs::function_object> f;
  gc_heap *local_1b8;
  pointer local_1b0;
  wostringstream woss;
  
  local_1d0 = __return_storage_ptr__;
  anon_unknown_65::get_function_object_ptr((anon_unknown_65 *)&f,this_);
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pvVar9) / 0x28) < 2) ||
     (pvVar9[1].type_ < boolean)) goto LAB_0013135c;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  this_02 = &this->f;
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = pvVar9 + 1;
  if (pvVar9[1].type_ != object) {
    debug_print((wostream *)&woss,pvVar1,4,0x7fffffff,0);
    goto LAB_001313da;
  }
  p_00 = &value::object_value(pvVar1)->super_gc_heap_ptr_untyped;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&a.super_gc_heap_ptr_untyped,p_00);
  gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
  object::prototype((object *)&p);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
  if (*(int *)((long)pvVar4 + 0x20) < 2) {
    if (p.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
      pvVar4 = gc_heap_ptr_untyped::get(&p.super_gc_heap_ptr_untyped);
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
      (**(code **)(*plVar5 + 0x70))(&local_218,plVar5);
      pvVar6 = gc_heap_ptr_untyped::get(&local_218);
      if (pvVar4 == pvVar6) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_218);
        goto LAB_00131265;
      }
    }
    pgVar7 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
    bVar2 = global_object::is_arguments_array(pgVar7,&a);
    if (p.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_218);
    }
    if (!bVar2) {
      gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
      object::class_name((object *)&local_240);
      mjs::operator<<((wostream *)&woss,(string *)&local_240);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_240);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&p.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&a.super_gc_heap_ptr_untyped);
LAB_001313da:
      std::operator<<((wostream *)&woss," is not an (arguments) array");
      this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar7 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
      global_object::stack_trace_abi_cxx11_((wstring *)&local_240,pgVar7);
      a.super_gc_heap_ptr_untyped.heap_ =
           local_240.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
      a.super_gc_heap_ptr_untyped.pos_ = local_240.type_;
      a.super_gc_heap_ptr_untyped._12_4_ = local_240._4_4_;
      std::__cxx11::wstringbuf::str();
      p.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1f0._M_string_length;
      p.super_gc_heap_ptr_untyped._8_8_ = local_1f0._M_dataplus._M_p;
      native_error_exception::native_error_exception
                (this_01,type,(wstring_view *)&a,(wstring_view *)&p);
      __cxa_throw(this_01,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
LAB_00131265:
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
  local_1f0._M_dataplus._M_p = (pointer)0x6;
  local_1f0._M_string_length = 0x17e1d4;
  (**(code **)*puVar8)(&local_240,puVar8);
  uVar3 = to_uint32(&local_240);
  value::~value(&local_240);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::resize(&new_args,(ulong)uVar3);
  this_03 = (mjs *)0x0;
  for (lVar10 = 0; (ulong)uVar3 * 0x28 - lVar10 != 0; lVar10 = lVar10 + 0x28) {
    puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&a.super_gc_heap_ptr_untyped);
    index_string_abi_cxx11_(&local_1f0,this_03,index);
    local_1b8 = (gc_heap *)local_1f0._M_string_length;
    local_1b0 = local_1f0._M_dataplus._M_p;
    (**(code **)*puVar8)(&local_240,puVar8,&local_1b8);
    value::operator=((value *)((long)&(new_args.
                                       super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->type_ + lVar10),
                     &local_240);
    value::~value(&local_240);
    std::__cxx11::wstring::~wstring((wstring *)&local_1f0);
    this_03 = (mjs *)(ulong)((int)this_03 + 1);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&p.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&a.super_gc_heap_ptr_untyped);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&woss);
LAB_0013135c:
  this_00 = (function_object *)gc_heap_ptr_untyped::get(&f.super_gc_heap_ptr_untyped);
  pvVar1 = local_1d0;
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar9 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar9 = (pointer)&value::undefined;
  }
  function_object::call(local_1d0,this_00,pvVar9,&new_args);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&new_args);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&f.super_gc_heap_ptr_untyped);
  return pvVar1;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }